

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::TPZDohrPrecond
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this)

{
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffe8;
  TPZMatrix<float> *in_stack_fffffffffffffff0;
  
  TPZMatrix<float>::TPZMatrix(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__TPZDohrPrecond_025a49b8;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
          *)0x1f7c423);
  in_RDI[7] = 0;
  in_RDI[8] = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 9) = 0xffffffff;
  TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_stack_fffffffffffffff0);
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond() : fCoarse(0), fNumCoarse(-1), fNumThreads(-1)
{
}